

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITab::draw(CGUITab *this)

{
  long *plVar1;
  
  if (this->field_0xa0 == '\x01') {
    plVar1 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if ((plVar1 != (long *)0x0) && (this->DrawBackground == true)) {
      (**(code **)(*plVar1 + 0xa8))
                (plVar1,this,&this->BackColor,&this->field_0x40,&this->field_0x50);
    }
    IGUIElement::draw((IGUIElement *)this);
    return;
  }
  return;
}

Assistant:

void CGUITab::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	if (skin && DrawBackground)
		skin->draw2DRectangle(this, BackColor, AbsoluteRect, &AbsoluteClippingRect);

	IGUIElement::draw();
}